

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_compat.cc
# Opt level: O3

int CBB_finish_i2d(CBB *cbb,uint8_t **outp)

{
  ulong __n;
  int iVar1;
  long lVar2;
  uint8_t *__dest;
  uint8_t *der;
  size_t der_len;
  uint8_t *local_20;
  int local_18;
  undefined4 uStack_14;
  
  if (cbb->is_child != '\0') {
    __assert_fail("!cbb->is_child",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/asn1_compat.cc"
                  ,0x1d,"int CBB_finish_i2d(CBB *, uint8_t **)");
  }
  if ((*(byte *)((long)&cbb->u + 0x18) & 1) != 0) {
    iVar1 = CBB_finish(cbb,&local_20,(size_t *)&local_18);
    if (iVar1 == 0) {
      CBB_cleanup(cbb);
    }
    else {
      __n = CONCAT44(uStack_14,local_18);
      if ((__n & 0xffffffff80000000) == 0) {
        if (outp != (uint8_t **)0x0) {
          __dest = *outp;
          if (__dest == (uint8_t *)0x0) {
            *outp = local_20;
            local_20 = (uint8_t *)0x0;
          }
          else {
            if (__n == 0) {
              lVar2 = 0;
            }
            else {
              memcpy(__dest,local_20,__n);
              lVar2 = CONCAT44(uStack_14,local_18);
              __dest = *outp;
            }
            *outp = __dest + lVar2;
          }
        }
        OPENSSL_free(local_20);
        return local_18;
      }
      OPENSSL_free(local_20);
    }
    return -1;
  }
  __assert_fail("cbb->u.base.can_resize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/asn1_compat.cc"
                ,0x1e,"int CBB_finish_i2d(CBB *, uint8_t **)");
}

Assistant:

int CBB_finish_i2d(CBB *cbb, uint8_t **outp) {
  assert(!cbb->is_child);
  assert(cbb->u.base.can_resize);

  uint8_t *der;
  size_t der_len;
  if (!CBB_finish(cbb, &der, &der_len)) {
    CBB_cleanup(cbb);
    return -1;
  }
  if (der_len > INT_MAX) {
    OPENSSL_free(der);
    return -1;
  }
  if (outp != NULL) {
    if (*outp == NULL) {
      *outp = der;
      der = NULL;
    } else {
      OPENSSL_memcpy(*outp, der, der_len);
      *outp += der_len;
    }
  }
  OPENSSL_free(der);
  return (int)der_len;
}